

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurVectorBuffer<embree::Vec3fx>
            (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             *vectors_in,Transformations *spaces)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_type sVar7;
  undefined8 *puVar8;
  long in_RDX;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RSI;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_RDI;
  size_t i_5;
  avector<embree::Vec3fx> vecs_1;
  AffineSpace3ff space;
  float time;
  size_t t;
  size_t j;
  avector<embree::Vec3fx> vecs;
  size_t i;
  size_t num_vertices;
  size_t num_time_steps;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *vectors_out;
  size_t i_6;
  size_t i_7;
  size_t i_2;
  size_t i_3;
  size_t i_4;
  size_t i_1;
  value_type *in_stack_fffffffffffff598;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffff5a0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *pvVar9;
  size_t in_stack_fffffffffffff5a8;
  Vec3fx *in_stack_fffffffffffff5d0;
  Transformations *in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  float local_a04;
  BBox1f local_988;
  BBox1f BStack_980;
  pointer local_970;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  local_968;
  Transformations *local_950;
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  undefined1 local_928 [36];
  float local_904;
  ulong local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  pointer local_8e0;
  undefined1 local_8d8 [8];
  pointer local_8d0;
  pointer local_8c8;
  void *local_8c0;
  ulong local_8b8;
  pointer local_8a0;
  size_type local_898;
  undefined1 local_889;
  long local_888;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_880;
  long local_870;
  const_reference local_868;
  pointer local_860;
  const_reference local_858;
  pointer local_850;
  const_reference local_848;
  pointer local_840;
  const_reference local_838;
  pointer local_830;
  const_reference local_828;
  pointer local_820;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_818;
  pointer local_810;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_808;
  pointer local_800;
  undefined1 *local_7f8;
  pointer local_7f0;
  undefined1 *local_7e8;
  BBox1f *local_7e0;
  BBox1f *local_7d8;
  undefined8 *local_7d0;
  undefined8 *local_7c8;
  undefined1 *local_7c0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_7b0;
  pointer local_7a0;
  undefined1 *local_798;
  pointer local_790;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_788;
  long local_780;
  ulong local_778;
  long local_770;
  ulong local_768;
  long local_760;
  Vec3fx *local_758;
  undefined1 *local_750;
  BBox1f *local_748;
  Vec3fx *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  Vec3fx *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  undefined8 *local_688;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 *local_600;
  undefined8 *local_5f8;
  undefined8 *local_5f0;
  undefined8 *local_5e8;
  undefined8 *local_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 *local_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  float local_594;
  undefined8 *local_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_578;
  float local_574;
  undefined8 *local_570;
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  float local_558;
  float local_554;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  undefined8 *puStack_530;
  undefined8 *local_528;
  undefined8 *local_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  undefined8 *local_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 *local_470;
  undefined8 *local_468;
  undefined8 *local_460;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 *local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  Vec3fx *local_3c0;
  undefined1 *local_3b8;
  BBox1f *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined1 *local_388;
  undefined8 *local_380;
  BBox1f *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  BBox1f *local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  BBox1f *local_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_300;
  undefined1 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_284;
  undefined8 *local_280;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float local_264;
  undefined8 *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float local_244;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  undefined1 *puStack_220;
  undefined8 *local_218;
  undefined8 *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 *local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  pointer local_f0;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_e8;
  pointer local_d0;
  undefined1 *local_c8;
  pointer local_c0;
  void *local_b8;
  undefined1 *local_b0;
  pointer local_90;
  Transformations *local_88;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_80;
  pointer local_60;
  pointer local_58;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_50;
  pointer local_48;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *local_40;
  BBox1f *local_38;
  pointer local_30;
  pointer local_28;
  undefined1 *local_20;
  pointer local_18;
  undefined1 *local_10;
  void *local_8;
  
  local_888 = in_RDX;
  local_880 = in_RSI;
  sVar7 = std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::size(in_RSI);
  if (sVar7 == 0) {
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
             (vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  }
  else {
    local_889 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              *)0x339474);
    local_898 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::size(local_880);
    local_868 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::operator[](local_880,0);
    local_8a0 = (pointer)local_868->size_active;
    if (local_898 == 1) {
      local_8b8 = 0;
      while( true ) {
        local_870 = local_888;
        local_780 = local_888 + 8;
        if (*(ulong *)(local_888 + 0x10) <= local_8b8) break;
        local_798 = local_8d8;
        local_7a0 = local_8a0;
        local_8d0 = (pointer)0x0;
        local_8c8 = (pointer)0x0;
        local_8c0 = (void *)0x0;
        local_28 = local_8a0;
        local_20 = local_798;
        if (local_8a0 != (pointer)0x0) {
          local_18 = local_8a0;
          local_10 = local_798;
          local_8c0 = alignedMalloc(in_stack_fffffffffffff5a8,(size_t)in_stack_fffffffffffff5a0);
          for (local_30 = (pointer)0x0; local_30 < local_28;
              local_30 = (pointer)&local_30->field_0x1) {
            local_8 = (void *)((long)local_8c0 + (long)local_30 * 0x10);
          }
          local_8c8 = local_28;
        }
        local_8d0 = local_8c8;
        for (local_8e0 = (pointer)0x0; local_8e0 < local_8a0;
            local_8e0 = (pointer)&local_8e0->field_0x1) {
          local_770 = local_888;
          local_778 = local_8b8;
          local_760 = local_888 + 8;
          local_768 = local_8b8;
          puVar8 = (undefined8 *)(*(long *)(local_888 + 0x20) + local_8b8 * 0x40);
          local_828 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[](local_880,0);
          local_830 = local_8e0;
          local_740 = local_828->items + (long)local_8e0;
          local_730 = &local_8f8;
          local_594 = (local_740->field_0).m128[0];
          local_590 = &local_6e8;
          local_488 = CONCAT44(local_594,local_594);
          uStack_480 = CONCAT44(local_594,local_594);
          local_574 = (local_740->field_0).m128[1];
          local_570 = &local_708;
          local_4e8 = CONCAT44(local_574,local_574);
          uStack_4e0 = CONCAT44(local_574,local_574);
          local_608 = puVar8 + 2;
          local_554 = (local_740->field_0).m128[2];
          local_550 = &local_728;
          local_428 = CONCAT44(local_554,local_554);
          uStack_420 = CONCAT44(local_554,local_554);
          local_470 = puVar8 + 4;
          local_460 = &local_718;
          local_468 = &local_728;
          uVar1 = *local_470;
          uVar2 = puVar8[5];
          local_438._0_4_ = (float)uVar1;
          local_438._4_4_ = (float)((ulong)uVar1 >> 0x20);
          uStack_430._0_4_ = (float)uVar2;
          uStack_430._4_4_ = (float)((ulong)uVar2 >> 0x20);
          local_458 = local_554 * (float)local_438;
          fStack_454 = local_554 * local_438._4_4_;
          fStack_450 = local_554 * (float)uStack_430;
          fStack_44c = local_554 * uStack_430._4_4_;
          local_440 = &local_718;
          local_5f8 = &local_6f8;
          local_600 = &local_708;
          local_610 = &local_718;
          local_520 = &local_628;
          uVar3 = *local_608;
          uVar4 = puVar8[3];
          local_4f8._0_4_ = (float)uVar3;
          local_4f8._4_4_ = (float)((ulong)uVar3 >> 0x20);
          uStack_4f0._0_4_ = (float)uVar4;
          uStack_4f0._4_4_ = (float)((ulong)uVar4 >> 0x20);
          local_518 = local_574 * (float)local_4f8;
          fStack_514 = local_574 * local_4f8._4_4_;
          fStack_510 = local_574 * (float)uStack_4f0;
          fStack_50c = local_574 * uStack_4f0._4_4_;
          local_500 = &local_628;
          local_5a8 = CONCAT44(fStack_514,local_518);
          uStack_5a0 = CONCAT44(fStack_50c,fStack_510);
          local_5e0 = &local_6f8;
          local_5e8 = &local_628;
          local_5b8._0_4_ = (float)local_718;
          local_5b8._4_4_ = (float)((ulong)local_718 >> 0x20);
          uStack_5b0._0_4_ = (float)uStack_710;
          uStack_5b0._4_4_ = (float)((ulong)uStack_710 >> 0x20);
          local_5d8 = local_518 + (float)local_5b8;
          fStack_5d4 = fStack_514 + local_5b8._4_4_;
          fStack_5d0 = fStack_510 + (float)uStack_5b0;
          fStack_5cc = fStack_50c + uStack_5b0._4_4_;
          local_5c0 = &local_6f8;
          local_688 = &local_8f8;
          local_690 = &local_6e8;
          local_6a0 = &local_6f8;
          local_4c0 = &local_6b8;
          uVar5 = *puVar8;
          uVar6 = puVar8[1];
          local_498._0_4_ = (float)uVar5;
          local_498._4_4_ = (float)((ulong)uVar5 >> 0x20);
          uStack_490._0_4_ = (float)uVar6;
          uStack_490._4_4_ = (float)((ulong)uVar6 >> 0x20);
          local_4b8 = local_594 * (float)local_498;
          fStack_4b4 = local_594 * local_498._4_4_;
          fStack_4b0 = local_594 * (float)uStack_490;
          fStack_4ac = local_594 * uStack_490._4_4_;
          local_4a0 = &local_6b8;
          local_638 = CONCAT44(fStack_4b4,local_4b8);
          uStack_630 = CONCAT44(fStack_4ac,fStack_4b0);
          local_670 = &local_8f8;
          local_678 = &local_6b8;
          local_648._0_4_ = (float)local_6f8;
          local_648._4_4_ = (float)((ulong)local_6f8 >> 0x20);
          uStack_640._0_4_ = (float)uStack_6f0;
          uStack_640._4_4_ = (float)((ulong)uStack_6f0 >> 0x20);
          local_668 = local_4b8 + (float)local_648;
          fStack_664 = fStack_4b4 + local_648._4_4_;
          fStack_660 = fStack_4b0 + (float)uStack_640;
          fStack_65c = fStack_4ac + uStack_640._4_4_;
          local_650 = &local_8f8;
          local_8f8 = CONCAT44(fStack_664,local_668);
          uStack_8f0 = CONCAT44(fStack_65c,fStack_660);
          local_7e8 = local_8d8;
          local_7f0 = local_8e0;
          local_7c8 = (undefined8 *)((long)local_8c0 + (long)local_8e0 * 0x10);
          local_7d0 = &local_8f8;
          *local_7c8 = local_8f8;
          local_7c8[1] = uStack_8f0;
          local_738 = puVar8;
          local_6d0 = local_740;
          local_6c8 = puVar8;
          local_6c0 = local_730;
          local_698 = puVar8;
          local_680 = local_6a0;
          local_648 = local_6f8;
          uStack_640 = uStack_6f0;
          local_5f0 = local_610;
          local_5b8 = local_718;
          uStack_5b0 = uStack_710;
          local_588 = local_594;
          fStack_584 = local_594;
          fStack_580 = local_594;
          fStack_57c = local_594;
          local_578 = local_594;
          local_568 = local_574;
          fStack_564 = local_574;
          fStack_560 = local_574;
          fStack_55c = local_574;
          local_558 = local_574;
          local_548 = local_554;
          fStack_544 = local_554;
          fStack_540 = local_554;
          fStack_53c = local_554;
          local_538 = local_554;
          puStack_530 = local_608;
          local_528 = local_600;
          local_4f8 = uVar3;
          uStack_4f0 = uVar4;
          local_4d0 = puVar8;
          local_4c8 = local_690;
          local_498 = uVar5;
          uStack_490 = uVar6;
          local_438 = uVar1;
          uStack_430 = uVar2;
          local_728 = local_428;
          uStack_720 = uStack_420;
          local_718 = CONCAT44(fStack_454,local_458);
          uStack_710 = CONCAT44(fStack_44c,fStack_450);
          local_708 = local_4e8;
          uStack_700 = uStack_4e0;
          local_6f8 = CONCAT44(fStack_5d4,local_5d8);
          uStack_6f0 = CONCAT44(fStack_5cc,fStack_5d0);
          local_6e8 = local_488;
          uStack_6e0 = uStack_480;
          local_6b8 = local_638;
          uStack_6b0 = uStack_630;
          local_628 = local_5a8;
          uStack_620 = uStack_5a0;
          local_838 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[](local_880,0);
          local_840 = local_8e0;
          local_800 = local_8e0;
          local_7f8 = local_8d8;
          *(float *)((long)local_8c0 + (long)local_8e0 * 0x10 + 0xc) =
               local_838->items[(long)local_8e0].field_0.m128[3];
        }
        std::
        vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ::push_back(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
        local_7c0 = local_8d8;
        for (local_d0 = (pointer)0x0; local_d0 < local_8d0; local_d0 = (pointer)&local_d0->field_0x1
            ) {
        }
        local_c0 = local_8c8;
        local_b8 = local_8c0;
        local_c8 = local_7c0;
        local_b0 = local_7c0;
        alignedFree(in_stack_fffffffffffff598);
        local_8b8 = local_8b8 + 1;
      }
    }
    else {
      for (local_900 = 0; local_900 < local_898; local_900 = local_900 + 1) {
        if (local_898 < 2) {
          local_904 = 0.0;
        }
        else {
          local_a04 = (float)local_900;
          local_904 = local_a04 / (float)(local_898 - 1);
        }
        Transformations::interpolate
                  (in_stack_fffffffffffff5d8,(float)((ulong)in_stack_fffffffffffff5d0 >> 0x20));
        local_788 = &local_968;
        local_790 = local_8a0;
        local_968.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_968.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_950 = (Transformations *)0x0;
        local_58 = local_8a0;
        local_50 = local_788;
        if (local_8a0 != (pointer)0x0) {
          local_48 = local_8a0;
          local_40 = local_788;
          in_stack_fffffffffffff5d8 =
               (Transformations *)
               alignedMalloc(in_stack_fffffffffffff5a8,(size_t)in_stack_fffffffffffff5a0);
          for (local_60 = (pointer)0x0; local_60 < local_58;
              local_60 = (pointer)&local_60->field_0x1) {
            local_38 = &in_stack_fffffffffffff5d8->time_range + (long)local_60 * 2;
          }
          local_968.
          super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
          local_950 = in_stack_fffffffffffff5d8;
        }
        local_968.
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_968.
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (local_970 = (pointer)0x0; local_970 < local_8a0;
            local_970 = (pointer)&local_970->field_0x1) {
          local_848 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[](local_880,local_900);
          local_850 = local_970;
          in_stack_fffffffffffff5d0 = local_848->items + (long)local_970;
          local_748 = &local_988;
          local_750 = local_948;
          local_284 = (in_stack_fffffffffffff5d0->field_0).m128[0];
          local_280 = &local_3d8;
          local_178 = CONCAT44(local_284,local_284);
          uStack_170 = CONCAT44(local_284,local_284);
          local_264 = (in_stack_fffffffffffff5d0->field_0).m128[1];
          local_260 = &local_3f8;
          local_1d8 = CONCAT44(local_264,local_264);
          uStack_1d0 = CONCAT44(local_264,local_264);
          local_2f8 = local_938;
          local_244 = (in_stack_fffffffffffff5d0->field_0).m128[2];
          local_240 = &local_418;
          local_118 = CONCAT44(local_244,local_244);
          uStack_110 = CONCAT44(local_244,local_244);
          local_160 = local_928;
          local_150 = &local_408;
          local_158 = &local_418;
          local_128 = (float)local_928._0_8_;
          fStack_124 = SUB84(local_928._0_8_,4);
          fStack_120 = (float)local_928._8_8_;
          fStack_11c = SUB84(local_928._8_8_,4);
          local_148 = local_244 * local_128;
          fStack_144 = local_244 * fStack_124;
          fStack_140 = local_244 * fStack_120;
          fStack_13c = local_244 * fStack_11c;
          local_130 = &local_408;
          local_2e8 = &local_3e8;
          local_2f0 = &local_3f8;
          local_300 = &local_408;
          local_210 = &local_318;
          local_1e8 = (float)local_938._0_8_;
          fStack_1e4 = SUB84(local_938._0_8_,4);
          fStack_1e0 = (float)local_938._8_8_;
          fStack_1dc = SUB84(local_938._8_8_,4);
          local_208 = local_264 * local_1e8;
          fStack_204 = local_264 * fStack_1e4;
          fStack_200 = local_264 * fStack_1e0;
          fStack_1fc = local_264 * fStack_1dc;
          local_1f0 = &local_318;
          local_298 = CONCAT44(fStack_204,local_208);
          uStack_290 = CONCAT44(fStack_1fc,fStack_200);
          local_2d0 = &local_3e8;
          local_2d8 = &local_318;
          local_2a8._0_4_ = (float)local_408;
          local_2a8._4_4_ = (float)((ulong)local_408 >> 0x20);
          uStack_2a0._0_4_ = (float)uStack_400;
          uStack_2a0._4_4_ = (float)((ulong)uStack_400 >> 0x20);
          local_2c8 = local_208 + (float)local_2a8;
          fStack_2c4 = fStack_204 + local_2a8._4_4_;
          fStack_2c0 = fStack_200 + (float)uStack_2a0;
          fStack_2bc = fStack_1fc + uStack_2a0._4_4_;
          local_2b0 = &local_3e8;
          local_378 = &local_988;
          local_380 = &local_3d8;
          local_390 = &local_3e8;
          local_1b0 = &local_3a8;
          local_188 = (float)local_948._0_8_;
          fStack_184 = SUB84(local_948._0_8_,4);
          fStack_180 = (float)local_948._8_8_;
          fStack_17c = SUB84(local_948._8_8_,4);
          local_1a8 = local_284 * local_188;
          fStack_1a4 = local_284 * fStack_184;
          fStack_1a0 = local_284 * fStack_180;
          fStack_19c = local_284 * fStack_17c;
          local_190 = &local_3a8;
          local_328 = CONCAT44(fStack_1a4,local_1a8);
          uStack_320 = CONCAT44(fStack_19c,fStack_1a0);
          local_360 = &local_988;
          local_368 = &local_3a8;
          local_338._0_4_ = (float)local_3e8;
          local_338._4_4_ = (float)((ulong)local_3e8 >> 0x20);
          uStack_330._0_4_ = (float)uStack_3e0;
          uStack_330._4_4_ = (float)((ulong)uStack_3e0 >> 0x20);
          local_358 = local_1a8 + (float)local_338;
          fStack_354 = fStack_1a4 + local_338._4_4_;
          fStack_350 = fStack_1a0 + (float)uStack_330;
          fStack_34c = fStack_19c + uStack_330._4_4_;
          local_340 = &local_988;
          local_988.upper = fStack_354;
          local_988.lower = local_358;
          BStack_980.upper = fStack_34c;
          BStack_980.lower = fStack_350;
          local_808 = &local_968;
          local_810 = local_970;
          local_7d8 = &local_950->time_range + (long)local_970 * 2;
          local_7e0 = &local_988;
          *local_7d8 = local_988;
          local_7d8[1] = BStack_980;
          local_758 = in_stack_fffffffffffff5d0;
          local_3c0 = in_stack_fffffffffffff5d0;
          local_3b8 = local_750;
          local_3b0 = local_748;
          local_388 = local_750;
          local_370 = local_390;
          local_338 = local_3e8;
          uStack_330 = uStack_3e0;
          local_2e0 = local_300;
          local_2a8 = local_408;
          uStack_2a0 = uStack_400;
          local_278 = local_284;
          fStack_274 = local_284;
          fStack_270 = local_284;
          fStack_26c = local_284;
          local_268 = local_284;
          local_258 = local_264;
          fStack_254 = local_264;
          fStack_250 = local_264;
          fStack_24c = local_264;
          local_248 = local_264;
          local_238 = local_244;
          fStack_234 = local_244;
          fStack_230 = local_244;
          fStack_22c = local_244;
          local_228 = local_244;
          puStack_220 = local_2f8;
          local_218 = local_2f0;
          local_1c0 = local_750;
          local_1b8 = local_380;
          local_418 = local_118;
          uStack_410 = uStack_110;
          local_408 = CONCAT44(fStack_144,local_148);
          uStack_400 = CONCAT44(fStack_13c,fStack_140);
          local_3f8 = local_1d8;
          uStack_3f0 = uStack_1d0;
          local_3e8 = CONCAT44(fStack_2c4,local_2c8);
          uStack_3e0 = CONCAT44(fStack_2bc,fStack_2c0);
          local_3d8 = local_178;
          uStack_3d0 = uStack_170;
          local_3a8 = local_328;
          uStack_3a0 = uStack_320;
          local_318 = local_298;
          uStack_310 = uStack_290;
          local_858 = std::
                      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      ::operator[](local_880,local_900);
          local_860 = local_970;
          local_820 = local_970;
          local_818 = &local_968;
          *(float *)(&(local_950->spaces).field_0x4 + (long)local_970 * 0x10) =
               local_858->items[(long)local_970].field_0.m128[3];
        }
        std::
        vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ::push_back(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
        pvVar9 = &local_968;
        for (local_f0 = (pointer)0x0;
            local_f0 <
            local_968.
            super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; local_f0 = (pointer)&local_f0->field_0x1) {
        }
        local_90 = local_968.
                   super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_88 = local_950;
        local_7b0 = pvVar9;
        local_e8 = pvVar9;
        local_80 = pvVar9;
        alignedFree(in_stack_fffffffffffff598);
        in_stack_fffffffffffff5a0 = pvVar9;
        pvVar9[1].
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pvVar9->
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pvVar9->
        super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
  }
  return in_RDI;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurVectorBuffer(const std::vector<avector<Vertex>>& vectors_in, const Transformations& spaces)
    {
      if (vectors_in.size() == 0)
        return vectors_in;
      
      std::vector<avector<Vertex>> vectors_out;
      const size_t num_time_steps = vectors_in.size();
      const size_t num_vertices = vectors_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> vecs(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            vecs[j] = xfmVector(spaces[i],vectors_in[0][j]);
            vecs[j].w = vectors_in[0][j].w;
          }
          vectors_out.push_back(std::move(vecs));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> vecs(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            vecs[i] = xfmVector (space,vectors_in[t][i]);
            vecs[i].w = vectors_in[t][i].w;
          }
          vectors_out.push_back(std::move(vecs));
        }
      }
      return vectors_out;
    }